

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateDeviceIndexAtDefinition
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst)

{
  bool bVar1;
  spv_result_t sVar2;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  bVar1 = spvIsVulkanEnv(this->_->context_->target_env);
  if (bVar1) {
    local_48._8_8_ = 0;
    local_48._M_unused._M_object = operator_new(0x18);
    *(BuiltInsValidator **)local_48._M_unused._0_8_ = this;
    *(Instruction **)((long)local_48._M_unused._0_8_ + 8) = inst;
    *(Decoration **)((long)local_48._M_unused._0_8_ + 0x10) = decoration;
    local_30 = std::
               _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_builtins.cpp:3575:13)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_builtins.cpp:3575:13)>
               ::_M_manager;
    sVar2 = ValidateI32(this,decoration,inst,
                        (function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if (sVar2 != SPV_SUCCESS) {
      return sVar2;
    }
  }
  sVar2 = ValidateDeviceIndexAtReference(this,decoration,inst,inst,inst);
  return sVar2;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateDeviceIndexAtDefinition(
    const Decoration& decoration, const Instruction& inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (spv_result_t error = ValidateI32(
            decoration, inst,
            [this, &inst,
             &decoration](const std::string& message) -> spv_result_t {
              return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                     << _.VkErrorID(4206)
                     << "According to the Vulkan spec BuiltIn "
                     << _.grammar().lookupOperandName(
                            SPV_OPERAND_TYPE_BUILT_IN,
                            (uint32_t)decoration.builtin())
                     << " variable needs to be a 32-bit int scalar. "
                     << message;
            })) {
      return error;
    }
  }

  return ValidateDeviceIndexAtReference(decoration, inst, inst, inst);
}